

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matlabfunctions.cpp
# Opt level: O1

void interp1Q(double x,double shift,double *y,int x_length,double *xi,int xi_length,double *yi)

{
  void *pvVar1;
  void *pvVar2;
  void *pvVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  
  uVar6 = (long)xi_length * 8;
  uVar5 = (long)xi_length * 4;
  if (xi_length < 0) {
    uVar6 = 0xffffffffffffffff;
  }
  if (xi_length < 0) {
    uVar5 = 0xffffffffffffffff;
  }
  pvVar1 = operator_new__(uVar6);
  uVar6 = (long)x_length * 8;
  if (x_length < 0) {
    uVar6 = 0xffffffffffffffff;
  }
  pvVar2 = operator_new__(uVar6);
  pvVar3 = operator_new__(uVar5);
  if (0 < xi_length) {
    uVar6 = 0;
    do {
      dVar7 = (xi[uVar6] - x) / shift;
      *(int *)((long)pvVar3 + uVar6 * 4) = (int)dVar7;
      *(double *)((long)pvVar1 + uVar6 * 8) = dVar7 - (double)(int)dVar7;
      uVar6 = uVar6 + 1;
    } while ((uint)xi_length != uVar6);
  }
  if (1 < x_length) {
    uVar6 = 0;
    do {
      *(double *)((long)pvVar2 + uVar6 * 8) = y[uVar6 + 1] - y[uVar6];
      uVar6 = uVar6 + 1;
    } while (x_length - 1 != uVar6);
  }
  *(undefined8 *)((long)pvVar2 + (long)x_length * 8 + -8) = 0;
  if (0 < xi_length) {
    uVar6 = 0;
    do {
      lVar4 = (long)*(int *)((long)pvVar3 + uVar6 * 4);
      yi[uVar6] = *(double *)((long)pvVar2 + lVar4 * 8) * *(double *)((long)pvVar1 + uVar6 * 8) +
                  y[lVar4];
      uVar6 = uVar6 + 1;
    } while ((uint)xi_length != uVar6);
  }
  operator_delete__(pvVar1);
  operator_delete__(pvVar3);
  operator_delete__(pvVar2);
  return;
}

Assistant:

void interp1Q(double x, double shift, const double *y, int x_length,
    const double *xi, int xi_length, double *yi) {
  double *xi_fraction = new double[xi_length];
  double *delta_y = new double[x_length];
  int *xi_base = new int[xi_length];

  double delta_x = shift;
  for (int i = 0; i < xi_length; ++i) {
    xi_base[i] = static_cast<int>((xi[i] - x) / delta_x);
    xi_fraction[i] = (xi[i] - x) / delta_x - xi_base[i];
  }
  diff(y, x_length, delta_y);
  delta_y[x_length - 1] = 0.0;

  for (int i = 0; i < xi_length; ++i)
    yi[i] = y[xi_base[i]] + delta_y[xi_base[i]] * xi_fraction[i];

  // Bug was fixed at 2013/07/14 by M. Morise
  delete[] xi_fraction;
  delete[] xi_base;
  delete[] delta_y;
}